

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
SupportVertexCallback::processTriangle
          (SupportVertexCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 *puVar1;
  cbtScalar cVar2;
  float fVar3;
  cbtScalar cVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [64];
  
  auVar8 = ZEXT464((uint)this->m_maxDot);
  cVar2 = (this->m_supportVecLocal).m_floats[0];
  fVar3 = (this->m_supportVecLocal).m_floats[1];
  cVar4 = (this->m_supportVecLocal).m_floats[2];
  lVar7 = 0;
  do {
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * *(float *)((long)triangle->m_floats + lVar7 + 4)
                                           )),ZEXT416((uint)cVar2),
                             ZEXT416(*(uint *)((long)triangle->m_floats + lVar7)));
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)cVar4),
                             ZEXT416(*(uint *)((long)triangle->m_floats + lVar7 + 8)));
    if (auVar8._0_4_ < auVar5._0_4_) {
      puVar1 = (undefined8 *)((long)triangle->m_floats + lVar7);
      this->m_maxDot = auVar5._0_4_;
      uVar6 = puVar1[1];
      *(undefined8 *)(this->m_supportVertexLocal).m_floats = *puVar1;
      *(undefined8 *)((this->m_supportVertexLocal).m_floats + 2) = uVar6;
      auVar8 = ZEXT1664(auVar5);
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x30);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		(void)partId;
		(void)triangleIndex;
		for (int i = 0; i < 3; i++)
		{
			cbtScalar dot = m_supportVecLocal.dot(triangle[i]);
			if (dot > m_maxDot)
			{
				m_maxDot = dot;
				m_supportVertexLocal = triangle[i];
			}
		}
	}